

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenDiskFile(DiskSourceTree *this,string_view filename)

{
  int iVar1;
  int *piVar2;
  FileInputStream *this_00;
  char *pcVar3;
  stat sb;
  long *local_e8 [2];
  long local_d8 [2];
  DiskSourceTree *local_c8;
  stat local_c0;
  
  pcVar3 = filename._M_str;
  local_c8 = this;
  while( true ) {
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,pcVar3,pcVar3 + filename._M_len);
    iVar1 = stat((char *)local_e8[0],&local_c0);
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if (iVar1 == 0) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
LAB_001f80d2:
      do {
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e8,pcVar3,pcVar3 + filename._M_len);
        iVar1 = open((char *)local_e8[0],0);
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
      } while ((iVar1 < 0) && (piVar2 = __errno_location(), *piVar2 == 4));
      if (iVar1 < 0) {
        this_00 = (FileInputStream *)0x0;
      }
      else {
        this_00 = (FileInputStream *)operator_new(0x58);
        io::FileInputStream::FileInputStream(this_00,iVar1,-1);
        (this_00->copying_input_).close_on_delete_ = true;
      }
      return &this_00->super_ZeroCopyInputStream;
    }
  }
  if ((local_c0.st_mode & 0xf000) == 0x4000) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_c8->last_error_message_,0,
               (char *)(local_c8->last_error_message_)._M_string_length,0x3e87cc);
    return (ZeroCopyInputStream *)0x0;
  }
  goto LAB_001f80d2;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenDiskFile(
    absl::string_view filename) {
  struct stat sb;
  int ret = 0;
  do {
    ret = stat(std::string(filename).c_str(), &sb);
  } while (ret != 0 && errno == EINTR);
#if defined(_WIN32)
  if (ret == 0 && sb.st_mode & S_IFDIR) {
    last_error_message_ = "Input file is a directory.";
    return nullptr;
  }
#else
  if (ret == 0 && S_ISDIR(sb.st_mode)) {
    last_error_message_ = "Input file is a directory.";
    return nullptr;
  }
#endif
  int file_descriptor;
  do {
    file_descriptor = open(std::string(filename).c_str(), O_RDONLY);
  } while (file_descriptor < 0 && errno == EINTR);
  if (file_descriptor >= 0) {
    io::FileInputStream* result = new io::FileInputStream(file_descriptor);
    result->SetCloseOnDelete(true);
    return result;
  } else {
    return nullptr;
  }
}